

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRetF.c
# Opt level: O1

int Aig_ManRetimeMark_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  if ((*(ulong *)&pObj->field_0x18 & 0x20) != 0) {
    return 1;
  }
  uVar1 = (uint)*(ulong *)&pObj->field_0x18 & 7;
  if (uVar1 == 2) {
    return 0;
  }
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                  ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
  }
  if (uVar1 != 1) {
    if (pObj->TravId == p->nTravIds) {
      return 0;
    }
    pObj->TravId = p->nTravIds;
    iVar2 = Aig_ManRetimeMark_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    uVar3 = *(ulong *)&pObj->field_0x18;
    if (iVar2 == 0) {
      if ((((uint)uVar3 & 7) - 7 < 0xfffffffe) ||
         (iVar2 = Aig_ManRetimeMark_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe)),
         iVar2 == 0)) {
        if ((pObj->field_0x18 & 0x20) == 0) {
          return 0;
        }
        __assert_fail("pObj->fMarkB == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRetF.c"
                      ,0x3a,"int Aig_ManRetimeMark_rec(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar3 = *(ulong *)&pObj->field_0x18;
    }
    *(ulong *)&pObj->field_0x18 = uVar3 | 0x20;
    return 1;
  }
  return 0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Mark the nodes reachable from the PIs in the reverse order.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Aig_ManRetimeMark_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( pObj->fMarkB )
        return 1;
    if ( Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
        return 0;
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return pObj->fMarkB;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ManRetimeMark_rec( p, Aig_ObjFanin0(pObj) ) )
        return pObj->fMarkB = 1;
    if ( Aig_ObjIsNode(pObj) && Aig_ManRetimeMark_rec( p, Aig_ObjFanin1(pObj) ) )
        return pObj->fMarkB = 1;
    assert( pObj->fMarkB == 0 );
    return 0;
}